

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O2

int __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::cmp
          (iterator *this,void *param_1,void *param_2)

{
  ulong uVar1;
  int iVar2;
  _Elt_pointer psVar3;
  
  psVar3 = (this->stack_).c.
           super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar3 == (this->stack_).c.
                super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    __assert_fail("!stack_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                  ,0xa72,
                  "int unodb::olc_db<unsigned long, std::span<const std::byte>>::iterator::cmp(const art_key_type &) const [Key = unsigned long, Value = std::span<const std::byte>]"
                 );
  }
  if (psVar3 == (this->stack_).c.
                super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    psVar3 = (this->stack_).c.
             super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
  }
  uVar1 = psVar3[-1].super_iter_result.node.tagged_ptr;
  if ((uVar1 & 7) == 0) {
    iVar2 = detail::compare((void *)(uVar1 + 0x20),(ulong)*(uint *)(uVar1 + 0x18),param_1,8);
    return iVar2;
  }
  __assert_fail("node.type() == node_type::LEAF",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                ,0xa74,
                "int unodb::olc_db<unsigned long, std::span<const std::byte>>::iterator::cmp(const art_key_type &) const [Key = unsigned long, Value = std::span<const std::byte>]"
               );
}

Assistant:

int olc_db<Key, Value>::iterator::cmp(const art_key_type& akey) const noexcept {
  // TODO(thompsonbry) : variable length keys. Explore a cheaper way
  // to handle the exclusive bound case when developing variable
  // length key support based on the maintained key buffer.
  UNODB_DETAIL_ASSERT(!stack_.empty());
  auto& node = stack_.top().node;
  UNODB_DETAIL_ASSERT(node.type() == node_type::LEAF);
  const auto* const leaf{node.template ptr<leaf_type*>()};
  return unodb::detail::compare(leaf->get_key_view(), akey.get_key_view());
}